

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

shared_ptr<duckdb::ValidityColumnData,_true> __thiscall
duckdb::SharedConstructor::
Create<duckdb::ValidityColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::ColumnData&>
          (SharedConstructor *this,BlockManager *args,DataTableInfo *args_1,unsigned_long *args_2,
          unsigned_long *args_3,ColumnData *args_4)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<duckdb::ValidityColumnData,_true> sVar2;
  undefined1 local_21;
  ValidityColumnData *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (ValidityColumnData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ValidityColumnData,std::allocator<duckdb::ValidityColumnData>,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::ColumnData&>
            (&local_18,&local_20,(allocator<duckdb::ValidityColumnData> *)&local_21,args,args_1,
             args_2,args_3,args_4);
  *(ValidityColumnData **)this = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_18._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.internal.super___shared_ptr<duckdb::ValidityColumnData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ValidityColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ValidityColumnData,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ValidityColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<T> Create(ARGS &&...args) {
		return make_shared_ptr<T>(std::forward<ARGS>(args)...);
	}